

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O2

void cmAddLinkDirectoryForTarget(void *arg,char *tgt,char *d)

{
  cmTarget *this;
  allocator<char> local_51;
  undefined1 local_50 [16];
  string local_40;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,tgt,(allocator<char> *)local_50);
  this = cmMakefile::FindLocalNonAliasTarget((cmMakefile *)arg,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  if (this == (cmTarget *)0x0) {
    cmSystemTools::Error
              ("Attempt to add link directories to non-existent target: ",tgt," for directory ",d);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,d,&local_51);
    cmMakefile::GetBacktrace((cmMakefile *)local_50);
    cmTarget::InsertLinkDirectory(this,&local_40,(cmListFileBacktrace *)local_50,false);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_50 + 8));
    std::__cxx11::string::~string((string *)&local_40);
  }
  return;
}

Assistant:

void CCONV cmAddLinkDirectoryForTarget(void* arg, const char* tgt,
                                       const char* d)
{
  cmMakefile* mf = static_cast<cmMakefile*>(arg);
  cmTarget* t = mf->FindLocalNonAliasTarget(tgt);
  if (!t) {
    cmSystemTools::Error(
      "Attempt to add link directories to non-existent target: ", tgt,
      " for directory ", d);
    return;
  }
  t->InsertLinkDirectory(d, mf->GetBacktrace());
}